

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macros.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Disa::console_format_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Disa *this,Log_Level level,source_location *location)

{
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  uint_least32_t __val;
  char *pcVar1;
  size_type sVar2;
  undefined7 in_register_00000011;
  source_location *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined4 local_134;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> suffix;
  size_type iter;
  source_location *location_local;
  Log_Level level_local;
  
  this_01 = (source_location *)CONCAT71(in_register_00000011,level);
  pcVar1 = std::source_location::file_name(this_01);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&suffix.field_2 + 8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,pcVar1);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (this_00,'/',0xffffffffffffffff);
  pcVar1 = std::source_location::file_name(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar1,&local_d9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_b8,&local_d8,sVar2 + 1,0xffffffffffffffff);
  std::operator+(&local_98,&local_b8,"::");
  __val = std::source_location::line(this_01);
  std::__cxx11::to_string(&local_110,__val);
  std::operator+(&local_78,&local_98,&local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,"]: ");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  switch((ulong)this & 0xff) {
  case 0:
    std::__cxx11::string::string
              ((string *)&local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(__return_storage_ptr__,"[Error|",&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    break;
  case 1:
    std::__cxx11::string::string
              ((string *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(__return_storage_ptr__,"[Warn |",&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    break;
  case 2:
    std::__cxx11::string::string
              ((string *)&local_158,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(__return_storage_ptr__,"[Info |",&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    break;
  case 3:
    std::__cxx11::string::string
              ((string *)&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(__return_storage_ptr__,"[Debug|",&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    break;
  default:
    std::__cxx11::string::string
              ((string *)&local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(&local_1d8,"[Error|",&local_1f8);
    std::operator+(&local_1b8,&local_1d8," Unrecognised log level parsed.");
    std::operator<<((ostream *)&std::cout,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    exit(1);
  }
  local_134 = 1;
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<char> console_format(const Log_Level level, const std::source_location& location) {
  auto const iter = std::basic_string_view<char>(location.file_name()).find_last_of('/');
  const auto suffix =
  std::basic_string<char>(location.file_name()).substr(iter + 1) + "::" + std::to_string(location.line()) + "]: ";
  switch(level) {
    case Log_Level::Debug:
      return "[Debug|" + std::basic_string(suffix);
    case Log_Level::Info:
      return "[Info |" + std::basic_string(suffix);
    case Log_Level::Warning:
      return "[Warn |" + std::basic_string(suffix);
    case Log_Level::Error:
      return "[Error|" + std::basic_string(suffix);
    default:
      std::cout << "[Error|" + std::basic_string(suffix) + " Unrecognised log level parsed.";
      exit(1);
  }
}